

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O0

void chacha_set_counter(chacha_state *S,uint64_t counter)

{
  chacha_state_internal *state;
  uint64_t counter_local;
  chacha_state *S_local;
  
  S->opaque[0x20] = (uint8_t)counter;
  S->opaque[0x21] = (uint8_t)(counter >> 8);
  S->opaque[0x22] = (uint8_t)(counter >> 0x10);
  S->opaque[0x23] = (uint8_t)(counter >> 0x18);
  S->opaque[0x24] = (uint8_t)(counter >> 0x20);
  S->opaque[0x25] = (uint8_t)(counter >> 0x28);
  S->opaque[0x26] = (uint8_t)(counter >> 0x30);
  S->opaque[0x27] = (uint8_t)(counter >> 0x38);
  return;
}

Assistant:

void
chacha_set_counter(chacha_state *S, uint64_t counter) {
    chacha_state_internal *state = (chacha_state_internal *)S;
    state->s[32] = (counter      ) & 0xff;
    state->s[33] = (counter >>  8) & 0xff;
    state->s[34] = (counter >> 16) & 0xff;
    state->s[35] = (counter >> 24) & 0xff;
    state->s[36] = (counter >> 32) & 0xff;
    state->s[37] = (counter >> 40) & 0xff;
    state->s[38] = (counter >> 48) & 0xff;
    state->s[39] = (counter >> 56);
}